

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::Result(BasicReporter *this,AssertionResult *assertionResult)

{
  SourceLineInfo *other;
  OfType OVar1;
  IConfig *pIVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  Colour *this_00;
  AssertionResultData *pAVar7;
  Colour okAnywayColour;
  allocator local_79;
  Colour successColour;
  ulong local_70;
  Colour colour;
  
  pIVar2 = (this->m_config).m_fullConfig.m_p;
  _successColour = (pointer)pIVar2;
  if (pIVar2 != (IConfig *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar2);
  }
  iVar4 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(pIVar2);
  if ((char)iVar4 == '\0') {
    OVar1 = (assertionResult->m_resultData).resultType;
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)&successColour);
    if (OVar1 == Ok) {
      return;
    }
  }
  else {
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)&successColour);
  }
  startSpansLazily(this);
  other = &(assertionResult->m_info).lineInfo;
  SourceLineInfo::SourceLineInfo((SourceLineInfo *)&successColour,other);
  std::__cxx11::string::~string((string *)&successColour);
  if (local_70 != 0) {
    Colour::Colour(&colour,FileName);
    poVar5 = (this->m_config).m_stream;
    SourceLineInfo::SourceLineInfo((SourceLineInfo *)&successColour,other);
    poVar5 = operator<<(poVar5,(SourceLineInfo *)&successColour);
    std::operator<<(poVar5,": ");
    std::__cxx11::string::~string((string *)&successColour);
    Colour::~Colour(&colour);
  }
  if ((assertionResult->m_info).capturedExpression._M_string_length != 0) {
    Colour::Colour(&colour,Cyan);
    poVar5 = (this->m_config).m_stream;
    AssertionResult::getExpression_abi_cxx11_((string *)&successColour,assertionResult);
    std::operator<<(poVar5,(string *)&successColour);
    std::__cxx11::string::~string((string *)&successColour);
    if (((assertionResult->m_resultData).resultType & FailureBit) == Ok) {
      Colour::Colour(&successColour,Green);
      std::operator<<((this->m_config).m_stream," succeeded");
    }
    else {
      Colour::Colour(&successColour,BrightRed);
      std::operator<<((this->m_config).m_stream," failed");
      if ((((assertionResult->m_resultData).resultType & FailureBit) == Ok) ||
         (((assertionResult->m_info).resultDisposition & SuppressFail) != Normal)) {
        Colour::Colour(&okAnywayColour,Green);
        std::operator<<((this->m_config).m_stream," - but was ok");
        Colour::~Colour(&okAnywayColour);
      }
    }
    Colour::~Colour(&successColour);
    Colour::~Colour(&colour);
  }
  OVar1 = (assertionResult->m_resultData).resultType;
  if (((uint)(OVar1 + Info) < 2) || ((uint)(OVar1 + 0xfffffff0) < 2)) {
LAB_00135b96:
    if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
      if ((OVar1 & FailureBit) == Ok) {
        Colour::Colour(&successColour,Green);
        std::operator<<((this->m_config).m_stream," succeeded");
      }
      else {
        Colour::Colour(&successColour,BrightRed);
        std::operator<<((this->m_config).m_stream," failed");
        if ((((assertionResult->m_resultData).resultType & FailureBit) == Ok) ||
           (((assertionResult->m_info).resultDisposition & SuppressFail) != Normal)) {
          Colour::Colour(&colour,Green);
          std::operator<<((this->m_config).m_stream," - but was ok");
          Colour::~Colour(&colour);
        }
      }
      Colour::~Colour(&successColour);
    }
    if ((assertionResult->m_resultData).message._M_string_length == 0) goto LAB_00135dd3;
    std::operator<<((this->m_config).m_stream,"\n");
    Colour::Colour(&okAnywayColour,ReconstructedExpression);
    std::__cxx11::string::string((string *)&successColour,"with message",&local_79);
    std::__cxx11::string::string
              ((string *)&colour,(string *)&(assertionResult->m_resultData).message);
    streamVariableLengthText(this,(string *)&successColour,(string *)&colour);
LAB_00135db5:
    std::__cxx11::string::~string((string *)&colour);
    std::__cxx11::string::~string((string *)&successColour);
    this_00 = &okAnywayColour;
  }
  else {
    if (OVar1 == Info) {
      Colour::Colour(&okAnywayColour,ReconstructedExpression);
      std::__cxx11::string::string((string *)&successColour,"info",&local_79);
      std::__cxx11::string::string
                ((string *)&colour,(string *)&(assertionResult->m_resultData).message);
      streamVariableLengthText(this,(string *)&successColour,(string *)&colour);
      goto LAB_00135db5;
    }
    if (OVar1 == Warning) {
      Colour::Colour(&okAnywayColour,ReconstructedExpression);
      std::__cxx11::string::string((string *)&successColour,"warning",&local_79);
      std::__cxx11::string::string
                ((string *)&colour,(string *)&(assertionResult->m_resultData).message);
      streamVariableLengthText(this,(string *)&successColour,(string *)&colour);
      goto LAB_00135db5;
    }
    if (OVar1 == ExplicitFailure) {
      Colour::Colour(&colour,BrightRed);
      poVar5 = std::operator<<((this->m_config).m_stream,"failed with message: \'");
      std::__cxx11::string::string
                ((string *)&successColour,(string *)&(assertionResult->m_resultData).message);
      poVar5 = std::operator<<(poVar5,(string *)&successColour);
      std::operator<<(poVar5,"\'");
LAB_00135c18:
      std::__cxx11::string::~string((string *)&successColour);
      this_00 = &colour;
    }
    else {
      if (OVar1 == Exception) goto LAB_00135b96;
      if (OVar1 != DidntThrowException) {
        if (OVar1 != ThrewException) goto LAB_00135dd3;
        Colour::Colour(&colour,BrightRed);
        pcVar6 = " with unexpected";
        if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
          pcVar6 = "Unexpected";
        }
        std::operator<<((this->m_config).m_stream,pcVar6);
        poVar5 = std::operator<<((this->m_config).m_stream," exception with message: \'");
        std::__cxx11::string::string
                  ((string *)&successColour,(string *)&(assertionResult->m_resultData).message);
        poVar5 = std::operator<<(poVar5,(string *)&successColour);
        std::operator<<(poVar5,"\'");
        goto LAB_00135c18;
      }
      Colour::Colour(&successColour,BrightRed);
      pcVar6 = " because no exception was thrown where one was expected";
      if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
        pcVar6 = "No exception thrown where one was expected";
      }
      std::operator<<((this->m_config).m_stream,pcVar6);
      this_00 = &successColour;
    }
  }
  Colour::~Colour(this_00);
LAB_00135dd3:
  bVar3 = AssertionResult::hasExpandedExpression(assertionResult);
  if (bVar3) {
    std::operator<<((this->m_config).m_stream," for: ");
    pAVar7 = &assertionResult->m_resultData;
    std::__cxx11::string::string((string *)&successColour,(string *)pAVar7);
    std::__cxx11::string::~string((string *)&successColour);
    if (0x28 < local_70) {
      std::operator<<((this->m_config).m_stream,"\n");
      std::__cxx11::string::string((string *)&successColour,(string *)pAVar7);
      std::__cxx11::string::~string((string *)&successColour);
      if (local_70 < 0x46) {
        std::operator<<((this->m_config).m_stream,"\t");
      }
    }
    Colour::Colour(&colour,ReconstructedExpression);
    poVar5 = (this->m_config).m_stream;
    std::__cxx11::string::string((string *)&successColour,(string *)pAVar7);
    std::operator<<(poVar5,(string *)&successColour);
    std::__cxx11::string::~string((string *)&successColour);
    Colour::~Colour(&colour);
  }
  std::endl<char,std::char_traits<char>>((this->m_config).m_stream);
  return;
}

Assistant:

virtual void Result( const AssertionResult& assertionResult ) {
            if( !m_config.fullConfig()->includeSuccessfulResults() && assertionResult.getResultType() == ResultWas::Ok )
                return;

            startSpansLazily();

            if( !assertionResult.getSourceInfo().empty() ) {
                Colour colour( Colour::FileName );
                m_config.stream() << assertionResult.getSourceInfo() << ": ";
            }

            if( assertionResult.hasExpression() ) {
                Colour colour( Colour::OriginalExpression );
                m_config.stream() << assertionResult.getExpression();
                if( assertionResult.succeeded() ) {
                    Colour successColour( Colour::Success );
                    m_config.stream() << " succeeded";
                }
                else {
                    Colour errorColour( Colour::Error );
                    m_config.stream() << " failed";
                    if( assertionResult.isOk() ) {
                        Colour okAnywayColour( Colour::Success );
                        m_config.stream() << " - but was ok";
                    }
                }
            }
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    {
                        Colour colour( Colour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream() << " with unexpected";
                        else
                            m_config.stream() << "Unexpected";
                        m_config.stream() << " exception with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::DidntThrowException:
                    {
                        Colour colour( Colour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream() << " because no exception was thrown where one was expected";
                        else
                            m_config.stream() << "No exception thrown where one was expected";
                    }
                    break;
                case ResultWas::Info:
                    {
                        Colour colour( Colour::ReconstructedExpression );
                        streamVariableLengthText( "info", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::Warning:
                    {
                        Colour colour( Colour::ReconstructedExpression );
                        streamVariableLengthText( "warning", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::ExplicitFailure:
                    {
                        Colour colour( Colour::Error );
                        m_config.stream() << "failed with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::Unknown: // These cases are here to prevent compiler warnings
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                    if( !assertionResult.hasExpression() ) {
                        if( assertionResult.succeeded() ) {
                            Colour colour( Colour::Success );
                            m_config.stream() << " succeeded";
                        }
                        else {
                            Colour colour( Colour::Error );
                            m_config.stream() << " failed";
                            if( assertionResult.isOk() ) {
                                Colour okAnywayColour( Colour::Success );
                                m_config.stream() << " - but was ok";
                            }
                        }
                    }
                    if( assertionResult.hasMessage() ) {
                        m_config.stream() << "\n";
                        Colour colour( Colour::ReconstructedExpression );
                        streamVariableLengthText( "with message", assertionResult.getMessage() );
                    }
                    break;
            }

            if( assertionResult.hasExpandedExpression() ) {
                m_config.stream() << " for: ";
                if( assertionResult.getExpandedExpression().size() > 40 ) {
                    m_config.stream() << "\n";
                    if( assertionResult.getExpandedExpression().size() < 70 )
                        m_config.stream() << "\t";
                }
                Colour colour( Colour::ReconstructedExpression );
                m_config.stream() << assertionResult.getExpandedExpression();
            }
            m_config.stream() << std::endl;
        }